

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

EntryType * __thiscall
JsUtil::
BaseDictionary<unsigned_int,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::AllocateEntries(BaseDictionary<unsigned_int,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *this,int size,bool zeroAllocate)

{
  Memory *this_00;
  SimpleHashedEntry<unsigned_int,_unsigned_int> *pSVar1;
  undefined7 in_register_00000011;
  code *allocator;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  local_40 = (undefined1  [8])&SimpleHashedEntry<unsigned_int,unsigned_int>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_133463;
  data.filename._0_4_ = 0x453;
  data.plusSize = (long)size;
  this_00 = (Memory *)Memory::HeapAllocator::TrackAllocInfo(this->alloc,(TrackAllocData *)local_40);
  if ((int)CONCAT71(in_register_00000011,zeroAllocate) == 0) {
    allocator = Memory::HeapAllocator::Alloc;
  }
  else {
    allocator = Memory::HeapAllocator::AllocZero;
  }
  pSVar1 = Memory::
           AllocateArray<Memory::HeapAllocator,JsUtil::SimpleHashedEntry<unsigned_int,unsigned_int>,false>
                     (this_00,(HeapAllocator *)allocator,0,(long)size);
  return pSVar1;
}

Assistant:

EntryType * AllocateEntries(DECLSPEC_GUARD_OVERFLOW int size, const bool zeroAllocate = true)
        {
            // Note that the choice of leaf/non-leaf node is decided for the EntryType on the basis of TValue. By default, if
            // TValue is a pointer, a non-leaf allocation is done. This behavior can be overridden by specializing
            // TypeAllocatorFunc for TValue.
            return
                AllocateArray<AllocatorType, EntryType, false>(
                    TRACK_ALLOC_INFO(alloc, EntryType, AllocatorType, 0, size),
                    zeroAllocate ? EntryAllocatorFuncType::GetAllocZeroFunc() : EntryAllocatorFuncType::GetAllocFunc(),
                    size);
        }